

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini.cpp
# Opt level: O0

void __thiscall setup::ini_entry::load(ini_entry *this,istream *is,info *i)

{
  uint16_t uVar1;
  uint uVar2;
  ulong uVar3;
  flag_type fVar4;
  flag_type fVar5;
  int_adapter<unsigned_int> *in_RDX;
  istream *in_RSI;
  long in_RDI;
  info *unaff_retaddr;
  istream *in_stack_00000008;
  item *in_stack_00000010;
  stored_flags<setup::(anonymous_namespace)::stored_ini_flags,_16UL> *in_stack_00000108;
  istream *in_stack_ffffffffffffff38;
  istream *in_stack_ffffffffffffff40;
  encoded_string local_78;
  encoded_string local_60;
  encoded_string local_48;
  encoded_string local_30;
  int_adapter<unsigned_int> *local_18;
  istream *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  uVar2 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX);
  if (uVar2 < 0x1030000) {
    util::load<unsigned_int>((istream *)0x1877bd);
  }
  util::encoded_string::encoded_string
            (&local_30,(string *)(in_RDI + 0x100),local_18[6].value_,
             (bitset<256UL> *)(local_18 + 0x138));
  util::operator>>(in_stack_ffffffffffffff40,(encoded_string *)in_stack_ffffffffffffff38);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    std::__cxx11::string::operator=((string *)(in_RDI + 0x100),"{windows}/WIN.INI");
  }
  util::encoded_string::encoded_string
            (&local_48,(string *)(in_RDI + 0x120),local_18[6].value_,
             (bitset<256UL> *)(local_18 + 0x138));
  util::operator>>(local_10,(encoded_string *)in_stack_ffffffffffffff38);
  util::encoded_string::encoded_string(&local_60,(string *)(in_RDI + 0x140),local_18[6].value_);
  util::operator>>(local_10,(encoded_string *)in_stack_ffffffffffffff38);
  util::encoded_string::encoded_string
            (&local_78,(string *)(in_RDI + 0x160),local_18[6].value_,
             (bitset<256UL> *)(local_18 + 0x138));
  util::operator>>(local_10,(encoded_string *)in_stack_ffffffffffffff38);
  item::load_condition_data(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  item::load_version_data((item *)local_10,in_stack_ffffffffffffff38,(version *)0x187959);
  uVar1 = setup::version::bits((version *)local_10);
  if (uVar1 == 0x10) {
    stored_flags<setup::(anonymous_namespace)::stored_ini_flags,_16UL>::stored_flags
              ((stored_flags<setup::(anonymous_namespace)::stored_ini_flags,_16UL> *)local_10,
               in_stack_ffffffffffffff38);
    fVar5 = stored_flags<setup::(anonymous_namespace)::stored_ini_flags,_16UL>::get
                      (in_stack_00000108);
    ((Type *)(in_RDI + 0x180))->super__Base_bitset<1UL> =
         (_Base_bitset<1UL>)fVar5._flags.super__Base_bitset<1UL>._M_w;
  }
  else {
    stored_flags<setup::(anonymous_namespace)::stored_ini_flags,_32UL>::stored_flags
              ((stored_flags<setup::(anonymous_namespace)::stored_ini_flags,_32UL> *)local_10,
               in_stack_ffffffffffffff38);
    fVar4 = stored_flags<setup::(anonymous_namespace)::stored_ini_flags,_32UL>::get
                      ((stored_flags<setup::(anonymous_namespace)::stored_ini_flags,_32UL> *)
                       in_stack_00000108);
    ((Type *)(in_RDI + 0x180))->super__Base_bitset<1UL> =
         (_Base_bitset<1UL>)fVar4._flags.super__Base_bitset<1UL>._M_w;
  }
  return;
}

Assistant:

void ini_entry::load(std::istream & is, const info & i) {
	
	if(i.version < INNO_VERSION(1, 3, 0)) {
		(void)util::load<boost::uint32_t>(is); // uncompressed size of the entry
	}
	
	is >> util::encoded_string(inifile, i.codepage, i.header.lead_bytes);
	if(inifile.empty()) {
		inifile = "{windows}/WIN.INI";
	}
	is >> util::encoded_string(section, i.codepage, i.header.lead_bytes);
	is >> util::encoded_string(key, i.codepage);
	is >> util::encoded_string(value, i.codepage, i.header.lead_bytes);
	
	load_condition_data(is, i);
	
	load_version_data(is, i.version);
	
	if(i.version.bits() != 16) {
		options = stored_flags<stored_ini_flags>(is).get();
	} else {
		options = stored_flags<stored_ini_flags, 16>(is).get();
	}
}